

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int try_unknown_verb(voccxdef *ctx,objnum actor,char **cmd,int *typelist,int wrdcnt,int *next_start,
                    int do_fuses,int vocerr_err,char *vocerr_msg,...)

{
  uchar uVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  char **ppcVar4;
  long lVar5;
  int do_fuses_00;
  runsdef *prVar6;
  int err;
  vocerr_va_info *argptr_00;
  vocidef **in_XMM0_Qa;
  vocidef **in_XMM1_Qa;
  vocidef **in_XMM2_Qa;
  vocidef **in_XMM3_Qa;
  vocidef **in_XMM4_Qa;
  vocidef **in_XMM5_Qa;
  vocidef **in_XMM6_Qa;
  vocidef **in_XMM7_Qa;
  va_list argptr;
  errdef fr_;
  undefined1 local_e8 [48];
  vocidef **local_b8;
  vocidef **local_a8;
  vocidef **local_98;
  vocidef **local_88;
  vocidef **local_78;
  vocidef **local_68;
  vocidef **local_58;
  vocidef **local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (wrdcnt == 0) {
    wrdcnt = -1;
    ppcVar4 = cmd;
    do {
      wrdcnt = wrdcnt + 1;
      pcVar2 = *ppcVar4;
      ppcVar4 = ppcVar4 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  if (ctx->voccxpuv == 0xffff) {
LAB_001f57f1:
    if (ctx->voccxunknown == 0) {
      argptr[0].gp_offset = 0x30;
      argptr[0].fp_offset = 0x30;
      argptr_00 = (vocerr_va_info *)argptr;
      argptr[0].overflow_arg_area = &stack0x00000020;
      argptr[0].reg_save_area = local_e8;
      vocerr_va_prep(ctx,(vocerr_va_info *)&fr_,vocerr_err,vocerr_msg,argptr);
      argptr[0].gp_offset = 0x30;
      argptr[0].fp_offset = 0x30;
      argptr[0].overflow_arg_area = &stack0x00000020;
      argptr[0].reg_save_area = local_e8;
      vocerr_va((voccxdef *)&fr_,(vocerr_va_info *)argptr,err,vocerr_msg,(__va_list_tag *)argptr_00)
      ;
    }
    return 0;
  }
  runpnum(ctx->voccxrun,(long)vocerr_err);
  voc_push_numlist(ctx,(uint *)typelist,wrdcnt);
  voc_push_toklist(ctx,cmd,wrdcnt);
  if (actor == 0xffff) {
    actor = ctx->voccxme;
  }
  runpobj(ctx->voccxrun,actor);
  iVar3 = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  fr_.errcode = iVar3;
  if (iVar3 != 0) {
    ctx->voccxerr->errcxptr = fr_.errprv;
    do_fuses_00 = 1;
    if ((iVar3 != 0x3f5) && (iVar3 != 0x3fb)) {
      if (iVar3 != 0x3f6) {
        errrse1(ctx->voccxerr,&fr_);
      }
      do_fuses_00 = 0;
    }
    ctx->voccxunknown = 0;
    goto LAB_001f5771;
  }
  fr_.errprv = ctx->voccxerr->errcxptr;
  ctx->voccxerr->errcxptr = &fr_;
  runfn(ctx->voccxrun,ctx->voccxpuv,4);
  prVar6 = ctx->voccxrun->runcxsp;
  uVar1 = prVar6[-1].runstyp;
  prVar6 = prVar6 + -1;
  ctx->voccxrun->runcxsp = prVar6;
  if (uVar1 == '\x01') {
    if (prVar6->runstyp != '\x01') {
      ctx->voccxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->voccxrun,0x3eb);
    }
    iVar3 = *(int *)&ctx->voccxrun->runcxsp->runsv;
    iVar3 = iVar3 - (uint)(0 < iVar3);
    *next_start = iVar3;
    if (iVar3 < 0) {
      wrdcnt = 0;
LAB_001f5877:
      iVar3 = wrdcnt;
      *next_start = iVar3;
    }
    else if (wrdcnt < iVar3) goto LAB_001f5877;
    for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
      if (((*(byte *)(typelist + lVar5) & 0x80) != 0) && (0 < ctx->voccxunknown)) {
        ctx->voccxunknown = ctx->voccxunknown + -1;
        iVar3 = *next_start;
      }
    }
  }
  else {
    if (uVar1 != '\b') {
      ctx->voccxerr->errcxptr = fr_.errprv;
      goto LAB_001f57f1;
    }
    *next_start = wrdcnt;
    ctx->voccxunknown = 0;
  }
  ctx->voccxerr->errcxptr = fr_.errprv;
  iVar3 = 0;
  do_fuses_00 = 1;
LAB_001f5771:
  iVar3 = exe_fuses_and_daemons(ctx,iVar3,do_fuses_00,actor,0xffff,(vocoldef *)0x0,0,0xffff,0xffff);
  return (uint)(iVar3 == 0);
}

Assistant:

int try_unknown_verb(voccxdef *ctx, objnum actor,
                     char **cmd, int *typelist, int wrdcnt, int *next_start,
                     int do_fuses, int vocerr_err, char *vocerr_msg, ...)
{
    int  show_msg;
    va_list  argptr;

    /* presume we won't show the message */
    show_msg = FALSE;

    /* determine the word count if the caller passed in zero */
    if (wrdcnt == 0)
    {
        /* count the words before the terminating null entry */
        for ( ; cmd[wrdcnt] != 0 ; ++wrdcnt) ;
    }

    /* if parseUnknownVerb exists, call it */
    if (ctx->voccxpuv != MCMONINV)
    {
        int  err;
        int  i;
        int  do_fuses;

        /* no error has occurred yet */
        err = 0;

        /* presume we will run the fuses */
        do_fuses = TRUE;

        /* push the error number argument */
        runpnum(ctx->voccxrun, (long)vocerr_err);

        /* push a list of the word types */
        voc_push_numlist(ctx, (uint *)typelist, wrdcnt);

        /* push a list of the words */
        voc_push_toklist(ctx, cmd, wrdcnt);

        /* use "Me" as the default actor */
        if (actor == MCMONINV)
            actor = ctx->voccxme;

        /* push the actor argument */
        runpobj(ctx->voccxrun, actor);

        /* catch any errors that occur while calling the function */
        ERRBEGIN(ctx->voccxerr)
        {
            /* invoke the function */
            runfn(ctx->voccxrun, ctx->voccxpuv, 4);

            /* get the return value */
            switch(runtostyp(ctx->voccxrun))
            {
            case DAT_TRUE:
                /* the command was handled */
                rundisc(ctx->voccxrun);

                /* consume the entire command */
                *next_start = wrdcnt;

                /* 
                 *   since the command has now been handled, forget about
                 *   any unknown words 
                 */
                ctx->voccxunknown = 0;
                break;

            case DAT_NUMBER:
                /* 
                 *   The command was handled, and the function indicated
                 *   the number of words it wants to skip.  Communicate
                 *   this information back to the caller in *next_start.
                 *   Since the routine returns the 1-based index of the
                 *   next entry, we must subtract one to get the number of
                 *   words actually consumed.  
                 */
                *next_start = runpopnum(ctx->voccxrun);
                if (*next_start > 0)
                    --(*next_start);

                /* make sure the value is in range */
                if (*next_start < 0)
                    *next_start = 0;
                else if (*next_start > wrdcnt)
                    *next_start = wrdcnt;

                /* 
                 *   forget about any unknown words in the list up to the
                 *   next word 
                 */
                for (i = 0 ; i < *next_start ; ++i)
                {
                    /* if this word was unknown, forget about that now */
                    if ((typelist[i] & VOCT_UNKNOWN) != 0
                        && ctx->voccxunknown > 0)
                        --(ctx->voccxunknown);
                }
                break;

            default:
                /* treat anything else like nil */

            case DAT_NIL:
                /* nil - command not handled; show the message */
                rundisc(ctx->voccxrun);
                show_msg = TRUE;
                break;
            }
        }
        ERRCATCH(ctx->voccxerr, err)
        {
            /* check the error */
            switch(err)
            {
            case ERR_RUNEXIT:
            case ERR_RUNEXITOBJ:
                /* 
                 *   Exit or exitobj was executed - skip to the fuses.
                 *   Forget about any unknown words, since we've finished
                 *   processing this command and we don't want to allow
                 *   "oops" processing.  
                 */
                ctx->voccxunknown = 0;
                break;

            case ERR_RUNABRT:
                /* 
                 *   abort was executed - skip to the end of the command,
                 *   but do not execute the fuses 
                 */
                do_fuses = FALSE;

                /*
                 *   Since we're aborting the command, ignore any
                 *   remaining unknown words - we're skipping out of the
                 *   command entirely, so we don't care that there were
                 *   unknown words in the command.  
                 */
                ctx->voccxunknown = 0;
                break;

            default:
                /* re-throw any other errors */
                errrse(ctx->voccxerr);
            }
        }
        ERREND(ctx->voccxerr);

        /* if we're not showing the message, process fuses and daemons */
        if (!show_msg)
        {
            /* execute fuses and daemons */
            if (exe_fuses_and_daemons(ctx, err, do_fuses,
                                      actor, MCMONINV, 0, 0,
                                      MCMONINV, MCMONINV) != 0)
            {
                /* 
                 *   aborted from fuses and daemons - return false to tell
                 *   the caller not to execute anything left on the
                 *   command line 
                 */
                return FALSE;
            }

            /* indicate that the game code successfully handled the command */
            return TRUE;
        }
    }

    /* 
     *   If we made it here, it means we're showing the default message.
     *   If we have unknown words, suppress the message so that we show
     *   the unknown word error instead after returning.
     */
    if (ctx->voccxunknown == 0)
    {
        struct vocerr_va_info info;

        /* prepare to format the message */
        va_start(argptr, vocerr_msg);
        vocerr_va_prep(ctx, &info, vocerr_err, vocerr_msg, argptr);
        va_end(argptr);

        /* format the mesage */
        va_start(argptr, vocerr_msg);
        vocerr_va(ctx, &info, vocerr_err, vocerr_msg, argptr);
        va_end(argptr);
    }

    /* indicate that the remainder of the command should be aborted */
    return FALSE;
}